

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_uqadd_s64_arm(CPUARMState *env,uint64_t a,uint64_t b)

{
  ulong local_28;
  uint64_t res;
  uint64_t b_local;
  uint64_t a_local;
  CPUARMState *env_local;
  
  local_28 = a + b;
  if (((a ^ 0xffffffffffffffff) & b & (local_28 ^ 0xffffffffffffffff) & 0x8000000000000000) == 0) {
    if ((a & (b ^ 0xffffffffffffffff) & local_28 & 0x8000000000000000) != 0) {
      (env->vfp).qc[0] = 1;
      local_28 = 0;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    local_28 = 0xffffffffffffffff;
  }
  return local_28;
}

Assistant:

uint64_t HELPER(neon_uqadd_s64)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint64_t res;
    res = a + b;
    /* We only need to look at the pattern of SIGN bits to detect
     * +ve/-ve saturation
     */
    if (~a & b & ~res & SIGNBIT64) {
        SET_QC();
        res = UINT64_MAX;
    } else if (a & ~b & res & SIGNBIT64) {
        SET_QC();
        res = 0;
    }
    return res;
}